

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

size_t duckdb_je_malloc_usable_size(void *ptr)

{
  tsd_t *tsd;
  uintptr_t in_RCX;
  rtree_t *rtree;
  rtree_metadata_t rVar1;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)__tls_get_addr(&PTR_027f6b60);
    if ((tsd->state).repr != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
    if (ptr == (void *)0x0) {
      return 0;
    }
    if (tsd != (tsd_t *)0x0) {
      rtree = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      goto LAB_01e74b80;
    }
  }
  else if (ptr == (void *)0x0) {
    return 0;
  }
  rtree = (rtree_t *)&stack0xfffffffffffffe70;
  duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  tsd = (tsd_t *)0x0;
LAB_01e74b80:
  rVar1 = rtree_metadata_read((tsdn_t *)tsd,rtree,(rtree_ctx_t *)ptr,in_RCX);
  return duckdb_je_sz_index2size_tab[rVar1.szind];
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_usable_size(JEMALLOC_USABLE_SIZE_CONST void *ptr) {
	LOG("core.malloc_usable_size.entry", "ptr: %p", ptr);

	size_t ret = je_malloc_usable_size_impl(ptr);

	LOG("core.malloc_usable_size.exit", "result: %zu", ret);
	return ret;
}